

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  undefined1 n_00 [16];
  undefined1 value [16];
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar6;
  char *pcVar7;
  reference pcVar8;
  size_t sVar9;
  char *p_00;
  basic_format_specs<char> *specs;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_RDI;
  char *data;
  int i;
  char *p;
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  const_iterator group;
  int n;
  int size;
  int num_digits;
  char sep;
  string groups;
  allocator<char> *in_stack_fffffffffffffc48;
  locale_ref in_stack_fffffffffffffc50;
  locale_ref in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>
  *in_stack_fffffffffffffcb0;
  anon_class_16_2_3f014a30 *in_stack_fffffffffffffcc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int iVar10;
  int local_30c;
  undefined1 local_308 [24];
  buffer<char> local_2f0 [16];
  format_decimal_result<char_*> local_d8;
  buffer<char> *local_c8;
  buffer<char> *local_c0;
  char local_b8 [48];
  undefined8 local_88;
  undefined8 local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  int local_70;
  int local_6c;
  buffer<char> *local_68;
  buffer<char> *local_60;
  int local_54;
  buffer<char> *local_50;
  char local_41 [17];
  buffer<char> *local_30;
  string local_28 [40];
  
  local_30 = in_RDI[1].container;
  grouping<char>(in_stack_fffffffffffffc58);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    local_50 = in_RDI[1].container;
    local_41[0] = thousands_sep<char>(in_stack_fffffffffffffc50);
    if (local_41[0] == '\0') {
      on_dec(in_stack_fffffffffffffcb0);
      local_41[1] = '\x01';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
    else {
      local_68 = in_RDI[4].container;
      local_60 = in_RDI[5].container;
      n_00._8_8_ = in_stack_fffffffffffffc58.locale_;
      n_00._0_8_ = in_stack_fffffffffffffc50.locale_;
      local_70 = count_digits((uint128_t)n_00);
      local_6c = local_70;
      local_54 = local_70;
      local_78._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        local_80 = std::__cxx11::string::cend();
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc50.locale_,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffc48);
        iVar10 = local_70;
        bVar2 = false;
        if (bVar1) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          bVar2 = false;
          if (*pcVar8 < iVar10) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_78);
            bVar2 = false;
            if ('\0' < *pcVar8) {
              pcVar8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_78);
              in_stack_fffffffffffffc8c = (int)*pcVar8;
              cVar3 = max_value<char>();
              bVar2 = in_stack_fffffffffffffc8c != cVar3;
            }
          }
        }
        iVar10 = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
        if (!bVar2) break;
        local_6c = local_6c + 1;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_78);
        local_70 = local_70 - *pcVar8;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_78);
      }
      local_88 = std::__cxx11::string::cend();
      bVar2 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc50.locale_,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc48);
      if (bVar2) {
        in_stack_fffffffffffffc88 = local_70 + -1;
        pcVar7 = (char *)std::__cxx11::string::back();
        local_6c = in_stack_fffffffffffffc88 / (int)*pcVar7 + local_6c;
      }
      local_c8 = in_RDI[4].container;
      local_c0 = in_RDI[5].container;
      value._8_4_ = in_stack_fffffffffffffc78;
      value._0_8_ = in_stack_fffffffffffffc70;
      value._12_4_ = in_stack_fffffffffffffc7c;
      local_d8 = format_decimal<char,unsigned__int128>
                           ((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                            (unsigned___int128)value,iVar10);
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50.locale_,in_stack_fffffffffffffc48);
      std::allocator<char>::~allocator((allocator<char> *)(local_308 + 0x17));
      local_6c = local_6c + *(int *)((long)(in_RDI + 6) + 4);
      local_308._16_4_ = to_unsigned<int>(local_6c);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50.locale_,(size_t)in_stack_fffffffffffffc48);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_308,local_41,1);
      local_30c = 0;
      bVar6.container = (buffer<char> *)std::__cxx11::string::cbegin();
      local_78._M_current = (char *)bVar6.container;
      pcVar7 = buffer<char>::data(local_2f0);
      pcVar7 = pcVar7 + (long)local_6c + -1;
      iVar10 = local_54;
      while (iVar10 = iVar10 + -1, 0 < iVar10) {
        p_00 = pcVar7 + -1;
        *pcVar7 = local_b8[iVar10];
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_78);
        pcVar7 = p_00;
        if ('\0' < *pcVar8) {
          local_30c = local_30c + 1;
          iVar4 = local_30c;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          pcVar7 = p_00;
          if (iVar4 % (int)*pcVar8 == 0) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_78);
            iVar4 = (int)*pcVar8;
            cVar3 = max_value<char>();
            pcVar7 = p_00;
            if (iVar4 != cVar3) {
              in_stack_fffffffffffffcd0 =
                   __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffc58.locale_,
                               (difference_type)in_stack_fffffffffffffc50.locale_);
              in_stack_fffffffffffffcc8 = (anon_class_16_2_3f014a30 *)std::__cxx11::string::cend();
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc50.locale_,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffc48);
              if (bVar2) {
                local_30c = 0;
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_78);
              }
              in_stack_fffffffffffffc50.locale_ = local_308;
              basic_string_view<char>::data
                        ((basic_string_view<char> *)in_stack_fffffffffffffc50.locale_);
              in_stack_fffffffffffffc58.locale_ =
                   basic_string_view<char>::data(in_stack_fffffffffffffc50.locale_);
              basic_string_view<char>::size
                        ((basic_string_view<char> *)in_stack_fffffffffffffc50.locale_);
              pcVar7 = p_00;
              sVar9 = basic_string_view<char>::size
                                ((basic_string_view<char> *)in_stack_fffffffffffffc50.locale_);
              make_checked<char>(p_00,sVar9);
              std::uninitialized_copy<char_const*,char*>
                        (p_00,(char *)in_stack_fffffffffffffc58.locale_,
                         (char *)in_stack_fffffffffffffc50.locale_);
              sVar9 = basic_string_view<char>::size((basic_string_view<char> *)local_308);
              pcVar7 = pcVar7 + -sVar9;
            }
          }
        }
      }
      specs = (basic_format_specs<char> *)(pcVar7 + -1);
      *pcVar7 = local_b8[0];
      if (*(int *)((long)(in_RDI + 6) + 4) != 0) {
        *(char *)&specs->width = '-';
      }
      buffer<char>::data(local_2f0);
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                     (bVar6.container,specs,CONCAT44(iVar10,in_stack_fffffffffffffcd8),
                      (size_t)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8);
      in_RDI->container = bVar6.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc50.locale_);
      local_41[1] = '\0';
      local_41[2] = '\0';
      local_41[3] = '\0';
      local_41[4] = '\0';
    }
  }
  else {
    on_dec(in_stack_fffffffffffffcb0);
    local_41[1] = '\x01';
    local_41[2] = '\0';
    local_41[3] = '\0';
    local_41[4] = '\0';
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }